

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMain.cpp
# Opt level: O1

void Test::printHelp(string *progName)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  long lVar5;
  char *pcVar6;
  SuiteEntry *entry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  bool bVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
  sortedSuites;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
  local_60;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Runs the test-suites. The list of all available test-suites can be found beneath. Passing no argument runs all suites marked with \'(default)\'."
             ,0x8e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Run with \'",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(progName->_M_dataplus)._M_p,progName->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," [options]\'",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--help",6);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Prints this help",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--list-tests[=<file>]",0x15);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Prints the list of test methods to the given output file or the standard output. Does not actually run any tests"
             ,0x70);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--test-pattern=<pattern>",0x18);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Runs only the test methods matching the given simplified glob pattern. Only full matches and wildcard (via \'*\') matching is supported."
             ,0x86);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Can be repeated to include test-methods matching any of the given patterns.",0x4b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--output=val",0xc);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Sets the output of the tests. Available options are: plain, colored, gcc, msvc, generic, junit. Defaults to \'plain\'"
             ,0x73);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-o=val",6);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\'plain\' prints simple text, \'colored\' uses console colors, \'gcc\', \'msvc\' and \'generic\' use compiler-like output syntax"
             ,0x76);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"--mode=val",10);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Sets the output mode to one of \'debug\', \'verbose\', \'terse\' in order of the amount of information printed. Defaults to \'terse\'"
             ,0x7d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 0x1e;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--output-file=file",0x12);
  *(undefined8 *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
       = 4;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Sets the optional output file to write to, defaults to \'stdout\'. \'colored\' output can only write to console!"
             ,0x6c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test suites:",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  pbVar2 = DAT_00134be0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if (availableSuites != DAT_00134be0) {
    __args_1 = availableSuites;
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Test::SuiteEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,Test::SuiteEntry_const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Test::SuiteEntry>,std::_Select1st<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Test::SuiteEntry>>>
                  *)&local_60,__args_1,(SuiteEntry *)__args_1);
      __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &__args_1[3]._M_string_length;
      p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (__args_1 != pbVar2);
  }
  for (; (_Rb_tree_header *)p_Var4 != p_Var1;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    *(undefined8 *)
     (std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18)) = 0x1e;
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
    *(undefined8 *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x10) = 4;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,*(char **)(p_Var4 + 4),(long)p_Var4[4]._M_parent);
    bVar7 = (p_Var4[5]._M_color & _S_black) == _S_red;
    pcVar6 = "";
    if (bVar7) {
      pcVar6 = " (default)";
    }
    lVar5 = 0;
    if (bVar7) {
      lVar5 = 10;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,lVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Test::SuiteEntry>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void printHelp(const std::string &progName) {
    static const int paramWidth = 30;
    static const int gapWidth = 4;
    std::cout << "Runs the test-suites. The list of all available test-suites can be found beneath. Passing no "
                 "argument runs all suites marked with '(default)'."
              << std::endl;
    std::cout << "Run with '" << progName << " [options]'" << std::endl;
    std::cout << std::endl;
    std::cout << std::setw(paramWidth) << "--help" << std::setw(gapWidth) << " " << "Prints this help" << std::endl;
    std::cout << std::setw(paramWidth) << "--list-tests[=<file>]" << std::setw(gapWidth) << " "
              << "Prints the list of test methods to the given output file or the standard output. Does not actually "
                 "run any tests"
              << std::endl;
    std::cout << std::setw(paramWidth) << "--test-pattern=<pattern>" << std::setw(gapWidth) << " "
              << "Runs only the test methods matching the given simplified glob pattern. Only full matches and "
                 "wildcard (via '*') matching is supported."
              << std::endl;
    std::cout << std::setw(paramWidth) << " " << std::setw(gapWidth) << " "
              << "Can be repeated to include test-methods matching any of the given patterns." << std::endl;
    std::cout << std::setw(paramWidth) << "--output=val" << std::setw(gapWidth) << " "
              << "Sets the output of the tests. Available options are: plain, colored, gcc, msvc, generic, junit. "
                 "Defaults to 'plain'"
              << std::endl;
    std::cout << std::setw(paramWidth) << "-o=val" << std::setw(gapWidth) << " "
              << "'plain' prints simple text, 'colored' uses console colors, 'gcc', 'msvc' and 'generic' use "
                 "compiler-like output syntax"
              << std::endl;
    std::cout << std::setw(paramWidth) << "--mode=val" << std::setw(gapWidth) << " "
              << "Sets the output mode to one of 'debug', 'verbose', 'terse' in order of the amount of information "
                 "printed. Defaults to 'terse'"
              << std::endl;
    std::cout << std::setw(paramWidth) << "--output-file=file" << std::setw(gapWidth) << " "
              << "Sets the optional output file to write to, defaults to 'stdout'. 'colored' output can only write to "
                 "console!"
              << std::endl;
    std::cout << std::endl;
    std::cout << "Test suites:" << std::endl;
    // sort suites by name
    std::map<std::string, SuiteEntry> sortedSuites;
    for (const auto &entry : availableSuites)
      sortedSuites.emplace(entry.name, entry);
    for (const auto &pair : sortedSuites) {
      std::cout << std::setw(paramWidth) << pair.first << std::setw(gapWidth) << " " << pair.second.description
                << (pair.second.has(RegistrationFlags::OMIT_FROM_DEFAULT) ? "" : " (default)") << std::endl;
    }
  }